

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedNumberFormat::stripWhitespace
          (RuleBasedNumberFormat *this,UnicodeString *description)

{
  short sVar1;
  int offset;
  UBool UVar2;
  char16_t cVar3;
  uint uVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  UnicodeString result;
  
  result.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003daac8;
  result.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar8 = 0;
  while (iVar8 != -1) {
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    uVar4 = (uint)sVar1;
    iVar6 = (description->fUnion).fFields.fLength;
    iVar7 = (int)uVar4 >> 5;
    if (sVar1 < 0) {
      iVar7 = iVar6;
    }
    offset = iVar8;
    if (iVar7 <= iVar8) break;
    while( true ) {
      iVar8 = (int)(short)uVar4 >> 5;
      if ((short)uVar4 < 0) {
        iVar8 = iVar6;
      }
      if (iVar8 <= offset) break;
      cVar3 = UnicodeString::doCharAt(description,offset);
      UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar3);
      if (UVar2 == '\0') break;
      uVar4 = (uint)(ushort)(description->fUnion).fStackFields.fLengthAndFlags;
      iVar6 = (description->fUnion).fFields.fLength;
      offset = offset + 1;
    }
    iVar5 = UnicodeString::indexOf(description,L';',offset);
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    iVar8 = -1;
    if (iVar5 == -1) {
      UnicodeString::doAppend(&result,description,offset,iVar6 - offset);
    }
    else if (iVar5 < iVar6) {
      iVar8 = iVar5 + 1;
      UnicodeString::doAppend(&result,description,offset,(iVar5 - offset) + 1);
    }
  }
  UnicodeString::setTo(description,&result);
  UnicodeString::~UnicodeString(&result);
  return;
}

Assistant:

void
RuleBasedNumberFormat::stripWhitespace(UnicodeString& description)
{
    // iterate through the characters...
    UnicodeString result;

    int start = 0;
    while (start != -1 && start < description.length()) {
        // seek to the first non-whitespace character...
        while (start < description.length()
            && PatternProps::isWhiteSpace(description.charAt(start))) {
            ++start;
        }

        // locate the next semicolon in the text and copy the text from
        // our current position up to that semicolon into the result
        int32_t p = description.indexOf(gSemiColon, start);
        if (p == -1) {
            // or if we don't find a semicolon, just copy the rest of
            // the string into the result
            result.append(description, start, description.length() - start);
            start = -1;
        }
        else if (p < description.length()) {
            result.append(description, start, p + 1 - start);
            start = p + 1;
        }

        // when we get here, we've seeked off the end of the string, and
        // we terminate the loop (we continue until *start* is -1 rather
        // than until *p* is -1, because otherwise we'd miss the last
        // rule in the description)
        else {
            start = -1;
        }
    }

    description.setTo(result);
}